

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

string * __thiscall
soul::HTMLGenerator::run_abi_cxx11_
          (string *__return_storage_ptr__,HTMLGenerator *this,CompileMessageList *errors,
          HTMLGenerationOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pFVar2;
  pointer pcVar3;
  bool bVar4;
  HTMLElement *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_> *__range2;
  File *f;
  pointer library;
  pointer pHVar7;
  pointer this_01;
  string_view value;
  string_view text;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  HTMLElement content;
  HTMLElement nav;
  ostringstream navText;
  ostringstream contentText;
  string local_530;
  string local_510;
  char *local_4f0;
  size_type local_4e8;
  char local_4e0;
  undefined7 uStack_4df;
  undefined8 uStack_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d0;
  size_type local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410;
  string local_3f0;
  HTMLElement local_3d0;
  HTMLElement local_378;
  undefined1 local_320 [64];
  pointer pHStack_2e0;
  pointer local_2d8;
  pointer pHStack_2d0;
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar4 = SourceCodeModel::rebuild
                    (&this->model,errors,
                     *(ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> *)options);
  if (bVar4) {
    createNav(&local_378,this);
    local_4d0 = &local_4c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"section","");
    local_3d0.name._M_dataplus._M_p = (pointer)&local_3d0.name.field_2;
    if (local_4d0 == &local_4c0) {
      local_3d0.name.field_2._8_8_ = local_4c0._8_8_;
    }
    else {
      local_3d0.name._M_dataplus._M_p = (pointer)local_4d0;
    }
    local_3d0.name.field_2._M_allocated_capacity._1_7_ = local_4c0._M_allocated_capacity._1_7_;
    local_3d0.name.field_2._M_local_buf[0] = local_4c0._M_local_buf[0];
    local_3d0.name._M_string_length = local_4c8;
    local_4c8 = 0;
    local_4c0._M_local_buf[0] = '\0';
    local_3d0.isContent = false;
    local_3d0.contentIsInline = false;
    local_3d0.properties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d0.properties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d0.properties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3d0.children.
    super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
    super__Vector_impl_data._M_start = (HTMLElement *)0x0;
    local_3d0.children.
    super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
    super__Vector_impl_data._M_finish = (HTMLElement *)0x0;
    local_3d0.children.
    super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    value._M_str = "content";
    value._M_len = 7;
    local_4d0 = &local_4c0;
    choc::html::HTMLElement::setID(&local_3d0,value);
    library = (this->model).files.
              super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (this->model).files.
             super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (library != pFVar2) {
      do {
        printLibrary(this,&local_3d0,library);
        library = library + 1;
      } while (library != pFVar2);
    }
    if ((options->templateContent)._M_string_length == 0) {
      local_4f0 = &local_4e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"html","");
      if (local_4f0 == &local_4e0) {
        local_320._24_8_ = uStack_4d8;
        local_320._0_8_ = local_320 + 0x10;
      }
      else {
        local_320._0_8_ = local_4f0;
      }
      local_320._17_7_ = uStack_4df;
      local_320[0x10] = local_4e0;
      local_320._8_8_ = local_4e8;
      local_4e8 = 0;
      local_4e0 = '\0';
      local_320[0x20] = false;
      local_320[0x21] = false;
      local_320._40_8_ = (pointer)0x0;
      local_320._48_8_ = (pointer)0x0;
      local_320._56_8_ = (pointer)0x0;
      pHStack_2e0 = (pointer)0x0;
      local_2d8 = (pointer)0x0;
      pHStack_2d0 = (pointer)0x0;
      paVar1 = &local_1a8[0].field_2;
      local_4f0 = &local_4e0;
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"lang","");
      value_00._M_str = "en-US";
      value_00._M_len = 5;
      choc::html::HTMLElement::setProperty((HTMLElement *)local_320,local_1a8,value_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"head","");
      std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
      emplace_back<std::__cxx11::string>
                ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                 &pHStack_2e0,&local_430);
      pHVar7 = local_2d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"title","");
      std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
      emplace_back<std::__cxx11::string>
                ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                 &pHVar7[-1].children,&local_450);
      text._M_str = "SOUL Documentation";
      text._M_len = 0x12;
      choc::html::HTMLElement::addContent
                (pHVar7[-1].children.
                 super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,text);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"link","");
      std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
      emplace_back<std::__cxx11::string>
                ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                 &pHVar7[-1].children,&local_470);
      pHVar7 = pHVar7[-1].children.
               super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rel","");
      value_01._M_str = "stylesheet";
      value_01._M_len = 10;
      this_00 = choc::html::HTMLElement::setProperty(pHVar7 + -1,local_1a8,value_01);
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"href","");
      value_02._M_str = (options->cssFilename)._M_dataplus._M_p;
      value_02._M_len = (options->cssFilename)._M_string_length;
      choc::html::HTMLElement::setProperty(this_00,&local_530,value_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"body","");
      std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
      emplace_back<std::__cxx11::string>
                ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                 &pHStack_2e0,&local_490);
      pHVar7 = local_2d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::
      emplace_back<choc::html::HTMLElement>(&pHVar7[-1].children,&local_378);
      std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::
      emplace_back<choc::html::HTMLElement>(&pHVar7[-1].children,&local_3d0);
      choc::html::HTMLElement::toDocument_abi_cxx11_
                (__return_storage_ptr__,(HTMLElement *)local_320,true);
      std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::~vector
                ((vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_> *)
                 &pHStack_2e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_320 + 0x28));
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if (local_378.children.
          super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_378.children.
          super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pHVar7 = local_378.children.
                 super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          choc::html::HTMLElement::print<std::__cxx11::ostringstream>
                    (pHVar7,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)local_320,0,(PrintStatus)0x1);
          pHVar7 = pHVar7 + 1;
        } while (pHVar7 != local_378.children.
                           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      pHVar7 = local_3d0.children.
               super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_3d0.children.
          super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_3d0.children.
          super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        this_01 = local_3d0.children.
                  super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          choc::html::HTMLElement::print<std::__cxx11::ostringstream>
                    (this_01,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)local_1a8,0,(PrintStatus)0x1);
          this_01 = this_01 + 1;
        } while (this_01 != pHVar7);
      }
      paVar1 = &local_530.field_2;
      pcVar3 = (options->templateContent)._M_dataplus._M_p;
      local_530._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_530,pcVar3,pcVar3 + (options->templateContent)._M_string_length);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"$NAVIGATION","");
      std::__cxx11::stringbuf::str();
      bVar4 = replaceTemplatePlaceholder(this,errors,&local_530,&local_4b0,&local_3f0);
      if (bVar4) {
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"$CONTENT","");
        std::__cxx11::stringbuf::str();
        bVar4 = replaceTemplatePlaceholder(this,errors,&local_530,&local_510,&local_410);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar5;
      if (bVar4 == false) {
        psVar6 = &__return_storage_ptr__->_M_string_length;
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p == paVar1) {
          paVar5->_M_allocated_capacity = local_530.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_530.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_530._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_530.field_2._M_allocated_capacity;
        }
        psVar6 = &local_530._M_string_length;
        __return_storage_ptr__->_M_string_length = local_530._M_string_length;
        paVar5 = paVar1;
        local_530._M_dataplus._M_p = (pointer)paVar1;
      }
      *psVar6 = 0;
      paVar5->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != paVar1) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
    }
    std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::~vector
              (&local_3d0.children);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3d0.properties);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0.name._M_dataplus._M_p != &local_3d0.name.field_2) {
      operator_delete(local_3d0.name._M_dataplus._M_p,
                      local_3d0.name.field_2._M_allocated_capacity + 1);
    }
    std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::~vector
              (&local_378.children);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_378.properties);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.name._M_dataplus._M_p != &local_378.name.field_2) {
      operator_delete(local_378.name._M_dataplus._M_p,
                      local_378.name.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string run (soul::CompileMessageList& errors,
                     const HTMLGenerationOptions& options)
    {
        if (! model.rebuild (errors, options.sourceFiles))
            return {};

        auto nav = createNav();

        choc::html::HTMLElement content ("section");
        content.setID ("content");

        for (auto& f : model.files)
            printLibrary (content, f);

        if (options.templateContent.empty())
        {
            choc::html::HTMLElement root ("html");
            root.setProperty ("lang", "en-US");

            auto& head = root.addChild ("head");
            head.addChild ("title").addContent ("SOUL Documentation");
            head.addChild ("link").setProperty ("rel", "stylesheet")
                                  .setProperty ("href", options.cssFilename);

            auto& body = root.addChild ("body");
            body.addChild (std::move (nav));
            body.addChild (std::move (content));
            return root.toDocument (true);
        }

        std::ostringstream navText, contentText;

        for (auto& c : nav.getChildren())
            c.writeToStream (navText, false);

        for (auto& c : content.getChildren())
            c.writeToStream (contentText, false);

        auto doc = options.templateContent;

        if (replaceTemplatePlaceholder (errors, doc, "$NAVIGATION", navText.str())
             && replaceTemplatePlaceholder (errors, doc, "$CONTENT", contentText.str()))
        {
            return doc;
        }

        return {};
    }